

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O0

void __thiscall nigel::AST_Parser::fillSFR(AST_Parser *this,shared_ptr<nigel::AstBlock> *block)

{
  element_type *peVar1;
  int local_820 [3];
  char local_814 [4];
  shared_ptr<nigel::AstVariable> local_810;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_800;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_7d0;
  int local_798 [3];
  char local_78c [4];
  shared_ptr<nigel::AstVariable> local_788;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_778;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_748;
  int local_710 [3];
  char local_704 [4];
  shared_ptr<nigel::AstVariable> local_700;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_6f0;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_6c0;
  int local_688 [3];
  char local_67c [4];
  shared_ptr<nigel::AstVariable> local_678;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_668;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_638;
  int local_600 [3];
  char local_5f4 [4];
  shared_ptr<nigel::AstVariable> local_5f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_5e0;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_5b0;
  int local_578 [3];
  char local_56c [4];
  shared_ptr<nigel::AstVariable> local_568;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_558;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_528;
  int local_4f0 [3];
  char local_4e4 [4];
  shared_ptr<nigel::AstVariable> local_4e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_4d0;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_4a0;
  int local_468 [3];
  char local_45c [4];
  shared_ptr<nigel::AstVariable> local_458;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_448;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_418;
  int local_3e0 [3];
  char local_3d4 [4];
  shared_ptr<nigel::AstVariable> local_3d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_3c0;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_390;
  int local_358 [3];
  char local_34c [4];
  shared_ptr<nigel::AstVariable> local_348;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_338;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_308;
  int local_2d0 [3];
  char local_2c4 [4];
  shared_ptr<nigel::AstVariable> local_2c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_2b0;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_280;
  int local_248 [3];
  char local_23c [4];
  shared_ptr<nigel::AstVariable> local_238;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_228;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_1f8;
  int local_1c0 [3];
  char local_1b4 [4];
  shared_ptr<nigel::AstVariable> local_1b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_1a0;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_170;
  int local_138 [3];
  char local_12c [4];
  shared_ptr<nigel::AstVariable> local_128;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_118;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_e8;
  int local_b0 [5];
  undefined4 local_9c;
  BasicType local_98;
  char local_94 [4];
  shared_ptr<nigel::AstVariable> local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  local_80;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_50;
  shared_ptr<nigel::AstBlock> *local_18;
  shared_ptr<nigel::AstBlock> *block_local;
  AST_Parser *this_local;
  
  local_18 = block;
  block_local = (shared_ptr<nigel::AstBlock> *)this;
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_94[0] = '\0';
  local_94[1] = '\0';
  local_94[2] = '\0';
  local_94[3] = '\0';
  local_98 = 0x80;
  local_9c = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_90,&local_94,(int *)"@P0",&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_80,(char (*) [4])"@P0",&local_90);
  local_b0[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_50,&local_80,local_b0);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_50);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_50);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_80);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_90);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_12c[0] = '\0';
  local_12c[1] = '\0';
  local_12c[2] = '\0';
  local_12c[3] = '\0';
  local_138[2] = 0x90;
  local_138[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_128,&local_12c,(int *)"@P1",(BasicType *)(local_138 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_118,(char (*) [4])"@P1",&local_128);
  local_138[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_e8,&local_118,local_138);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_e8);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_e8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_118);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_128);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_1b4[0] = '\0';
  local_1b4[1] = '\0';
  local_1b4[2] = '\0';
  local_1b4[3] = '\0';
  local_1c0[2] = 0xa0;
  local_1c0[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_1b0,&local_1b4,(int *)"@P2",(BasicType *)(local_1c0 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_1a0,(char (*) [4])"@P2",&local_1b0);
  local_1c0[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_170,&local_1a0,local_1c0);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_170);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_170);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_1a0);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_1b0);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_23c[0] = '\0';
  local_23c[1] = '\0';
  local_23c[2] = '\0';
  local_23c[3] = '\0';
  local_248[2] = 0xb0;
  local_248[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_238,&local_23c,(int *)"@P3",(BasicType *)(local_248 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_228,(char (*) [4])"@P3",&local_238);
  local_248[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_1f8,&local_228,local_248);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_1f8);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_1f8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_228);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_238);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_2c4[0] = '\0';
  local_2c4[1] = '\0';
  local_2c4[2] = '\0';
  local_2c4[3] = '\0';
  local_2d0[2] = 0x8a;
  local_2d0[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((MemModel *)&local_2c0,(char (*) [5])local_2c4,(int *)"@TL0",
             (BasicType *)(local_2d0 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[5],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_2b0,(char (*) [5])"@TL0",&local_2c0);
  local_2d0[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_280,&local_2b0,local_2d0);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_280);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_280);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_2b0);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_2c0);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_34c[0] = '\0';
  local_34c[1] = '\0';
  local_34c[2] = '\0';
  local_34c[3] = '\0';
  local_358[2] = 0x8b;
  local_358[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((MemModel *)&local_348,(char (*) [5])local_34c,(int *)"@TH0",
             (BasicType *)(local_358 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[5],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_338,(char (*) [5])"@TH0",&local_348);
  local_358[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_308,&local_338,local_358);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_308);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_308);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_338);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_348);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_3d4[0] = '\0';
  local_3d4[1] = '\0';
  local_3d4[2] = '\0';
  local_3d4[3] = '\0';
  local_3e0[2] = 0x8c;
  local_3e0[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((MemModel *)&local_3d0,(char (*) [5])local_3d4,(int *)"@TL1",
             (BasicType *)(local_3e0 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[5],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_3c0,(char (*) [5])"@TL1",&local_3d0);
  local_3e0[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_390,&local_3c0,local_3e0);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_390);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_390);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_3c0);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_3d0);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_45c[0] = '\0';
  local_45c[1] = '\0';
  local_45c[2] = '\0';
  local_45c[3] = '\0';
  local_468[2] = 0x8d;
  local_468[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((MemModel *)&local_458,(char (*) [5])local_45c,(int *)"@TH1",
             (BasicType *)(local_468 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[5],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_448,(char (*) [5])"@TH1",&local_458);
  local_468[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_418,&local_448,local_468);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_418);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_418);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_448);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_458);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_4e4[0] = '\0';
  local_4e4[1] = '\0';
  local_4e4[2] = '\0';
  local_4e4[3] = '\0';
  local_4f0[2] = 0x89;
  local_4f0[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((MemModel *)&local_4e0,(char (*) [6])local_4e4,(int *)"@TMOD",
             (BasicType *)(local_4f0 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[6],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_4d0,(char (*) [6])"@TMOD",&local_4e0);
  local_4f0[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_4a0,&local_4d0,local_4f0);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_4a0);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_4a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_4d0);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_4e0);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_56c[0] = '\0';
  local_56c[1] = '\0';
  local_56c[2] = '\0';
  local_56c[3] = '\0';
  local_578[2] = 0x88;
  local_578[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((MemModel *)&local_568,(char (*) [6])local_56c,(int *)"@TCON",
             (BasicType *)(local_578 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[6],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_558,(char (*) [6])"@TCON",&local_568);
  local_578[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_528,&local_558,local_578);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_528);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_528);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_558);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_568);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_5f4[0] = '\0';
  local_5f4[1] = '\0';
  local_5f4[2] = '\0';
  local_5f4[3] = '\0';
  local_600[2] = 0xb8;
  local_600[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_5f0,&local_5f4,(int *)"@IP",(BasicType *)(local_600 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_5e0,(char (*) [4])"@IP",&local_5f0);
  local_600[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_5b0,&local_5e0,local_600);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_5b0);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_5b0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_5e0);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_5f0);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_67c[0] = '\0';
  local_67c[1] = '\0';
  local_67c[2] = '\0';
  local_67c[3] = '\0';
  local_688[2] = 0xa8;
  local_688[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((MemModel *)&local_678,&local_67c,(int *)"@IE",(BasicType *)(local_688 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[4],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_668,(char (*) [4])"@IE",&local_678);
  local_688[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_638,&local_668,local_688);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_638);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_638);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_668);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_678);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_704[0] = '\0';
  local_704[1] = '\0';
  local_704[2] = '\0';
  local_704[3] = '\0';
  local_710[2] = 0x87;
  local_710[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((MemModel *)&local_700,(char (*) [6])local_704,(int *)"@PCON",
             (BasicType *)(local_710 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[6],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_6f0,(char (*) [6])"@PCON",&local_700);
  local_710[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_6c0,&local_6f0,local_710);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_6c0);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_6c0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_6f0);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_700);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_78c[0] = '\0';
  local_78c[1] = '\0';
  local_78c[2] = '\0';
  local_78c[3] = '\0';
  local_798[2] = 0x98;
  local_798[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((MemModel *)&local_788,(char (*) [6])local_78c,(int *)"@SCON",
             (BasicType *)(local_798 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[6],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_778,(char (*) [6])"@SCON",&local_788);
  local_798[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_748,&local_778,local_798);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_748);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_748);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_778);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_788);
  peVar1 = std::__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)block);
  local_814[0] = '\0';
  local_814[1] = '\0';
  local_814[2] = '\0';
  local_814[3] = '\0';
  local_820[2] = 0x99;
  local_820[1] = 1;
  std::make_shared<nigel::AstVariable,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((MemModel *)&local_810,(char (*) [6])local_814,(int *)"@SBUF",
             (BasicType *)(local_820 + 2));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::pair<const_char_(&)[6],_std::shared_ptr<nigel::AstVariable>,_true>
            (&local_800,(char (*) [6])"@SBUF",&local_810);
  local_820[0] = 0;
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_int,_true>
            (&local_7d0,&local_800,local_820);
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  ::push_back(&peVar1->variables,&local_7d0);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  ::~pair(&local_7d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>
  ::~pair(&local_800);
  std::shared_ptr<nigel::AstVariable>::~shared_ptr(&local_810);
  return;
}

Assistant:

void AST_Parser::fillSFR( std::shared_ptr<AstBlock> block )
	{
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P0", std::make_shared<AstVariable>( MemModel::fast, "@P0", 0x80, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P1", std::make_shared<AstVariable>( MemModel::fast, "@P1", 0x90, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P2", std::make_shared<AstVariable>( MemModel::fast, "@P2", 0xA0, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P3", std::make_shared<AstVariable>( MemModel::fast, "@P3", 0xB0, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TL0", std::make_shared<AstVariable>( MemModel::fast, "@TL0", 0x8A, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TH0", std::make_shared<AstVariable>( MemModel::fast, "@TH0", 0x8B, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TL1", std::make_shared<AstVariable>( MemModel::fast, "@TL1", 0x8C, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TH1", std::make_shared<AstVariable>( MemModel::fast, "@TH1", 0x8D, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TMOD", std::make_shared<AstVariable>( MemModel::fast, "@TMOD", 0x89, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TCON", std::make_shared<AstVariable>( MemModel::fast, "@TCON", 0x88, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@IP", std::make_shared<AstVariable>( MemModel::fast, "@IP", 0xB8, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@IE", std::make_shared<AstVariable>( MemModel::fast, "@IE", 0xA8, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@PCON", std::make_shared<AstVariable>( MemModel::fast, "@PCON", 0x87, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@SCON", std::make_shared<AstVariable>( MemModel::fast, "@SCON", 0x98, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@SBUF", std::make_shared<AstVariable>( MemModel::fast, "@SBUF", 0x99, BasicType::tByte ) ), 0 ) );
	}